

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall HighsSparseMatrix::scaleCol(HighsSparseMatrix *this,HighsInt col,double colScale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  long lVar7;
  long lVar8;
  
  if (this->format_ == kColwise) {
    piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[col];
    lVar7 = (long)iVar1;
    iVar2 = piVar4[(long)col + 1];
    if (iVar1 < iVar2) {
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pdVar5[lVar7] = pdVar5[lVar7] * colScale;
        lVar7 = lVar7 + 1;
      } while (iVar2 != lVar7);
    }
  }
  else {
    iVar1 = this->num_row_;
    if (0 < (long)iVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = 0;
      do {
        iVar2 = piVar4[lVar7];
        lVar8 = (long)iVar2;
        iVar3 = piVar4[lVar7 + 1];
        if (iVar2 < iVar3) {
          pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            if (piVar6[lVar8] == col) {
              pdVar5[lVar8] = pdVar5[lVar8] * colScale;
            }
            lVar8 = lVar8 + 1;
          } while (iVar3 != lVar8);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != iVar1);
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}